

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Float __thiscall pbrt::FloatDotsTexture::Evaluate(FloatDotsTexture *this,TextureEvalContext ctx)

{
  anon_class_24_3_48d30edf func;
  bool bVar1;
  TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
  *this_00;
  Float FVar2;
  undefined1 auVar3 [64];
  Point2f st;
  Tuple2<pbrt::Vector2,_float> local_98;
  undefined8 local_90;
  Vector2f *local_88;
  undefined8 *local_80;
  Tuple3<pbrt::Point3,_float> local_78 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_60 [4];
  Tuple2<pbrt::Point2,_float> local_30;
  undefined8 **ppuStack_28;
  Vector2f **local_20;
  undefined1 extraout_var [56];
  
  local_80 = &local_90;
  ppuStack_28 = &local_80;
  local_88 = (Vector2f *)&local_98;
  local_30 = (Tuple2<pbrt::Point2,_float>)local_78;
  local_90 = 0;
  local_20 = &local_88;
  local_98.x = 0.0;
  local_98.y = 0.0;
  local_78[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_78[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_78[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_78[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_78[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_78[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_60[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_60[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_60[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_60[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_60[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_60[1].z = ctx.dudx;
  aTStack_60[2].x = ctx.dudy;
  aTStack_60[2].y = ctx.dvdx;
  aTStack_60[2].z = ctx.dvdy;
  aTStack_60[3].x = (float)ctx.faceIndex;
  func.dstdx = (Vector2f **)ppuStack_28;
  func.ctx = (TextureEvalContext *)local_30;
  func.dstdy = local_20;
  auVar3._0_8_ = TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                 ::
                 Dispatch<pbrt::TextureMapping2DHandle::Map(pbrt::TextureEvalContext,pbrt::Vector2<float>*,pbrt::Vector2<float>*)const::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
                             *)this,func);
  auVar3._8_56_ = extraout_var;
  local_30 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3._0_16_);
  bVar1 = DotsBase::Inside((Point2f *)&local_30);
  if (bVar1) {
    this_00 = (TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
               *)&this->insideDot;
  }
  else {
    this_00 = (TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
               *)&this->outsideDot;
  }
  local_78[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
  local_78[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
  local_78[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
  local_78[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
  local_78[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
  local_78[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_60[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
  aTStack_60[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
  aTStack_60[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
  aTStack_60[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
  aTStack_60[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
  aTStack_60[1].z = ctx.dudx;
  aTStack_60[2].x = ctx.dudy;
  aTStack_60[2].y = ctx.dvdx;
  aTStack_60[2].z = ctx.dvdy;
  aTStack_60[3].x = (float)ctx.faceIndex;
  FVar2 = TaggedPointer<pbrt::FloatImageTexture,pbrt::GPUFloatImageTexture,pbrt::FloatMixTexture,pbrt::FloatScaledTexture,pbrt::FloatConstantTexture,pbrt::FloatBilerpTexture,pbrt::FloatCheckerboardTexture,pbrt::FloatDotsTexture,pbrt::FBmTexture,pbrt::FloatPtexTexture,pbrt::WindyTexture,pbrt::WrinkledTexture>
          ::
          Dispatch<pbrt::FloatTextureHandle::Evaluate(pbrt::TextureEvalContext)const::_lambda(auto:1)_1_>
                    (this_00,(TextureEvalContext *)local_78);
  return FVar2;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Vector2f dstdx, dstdy;
        Point2f st = mapping.Map(ctx, &dstdx, &dstdy);
        return Inside(st) ? insideDot.Evaluate(ctx) : outsideDot.Evaluate(ctx);
    }